

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiny_obj_loader.h
# Opt level: O0

bool __thiscall
tinyobj::MaterialFileReader::operator()
          (MaterialFileReader *this,string *matId,
          vector<tinyobj::material_t,_std::allocator<tinyobj::material_t>_> *materials,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
          *matMap,string *warn,string *err)

{
  undefined8 uVar1;
  bool bVar2;
  ulong uVar3;
  istream *piVar4;
  size_type sVar5;
  reference dir;
  char *pcVar6;
  ostream *poVar7;
  string local_9c0 [32];
  stringstream local_9a0 [8];
  stringstream ss_1;
  ostream local_990 [376];
  long local_818;
  ifstream matIStream_1;
  string local_610 [8];
  string filepath_1;
  stringstream local_5d0 [8];
  stringstream ss;
  ostream local_5c0 [380];
  uint local_444;
  long local_440;
  ifstream matIStream;
  undefined1 local_238 [8];
  string filepath;
  size_t i;
  string s;
  istringstream local_1e0 [8];
  istringstream f;
  undefined1 local_60 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  paths;
  char sep;
  string *err_local;
  string *warn_local;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  *matMap_local;
  vector<tinyobj::material_t,_std::allocator<tinyobj::material_t>_> *materials_local;
  string *matId_local;
  MaterialFileReader *this_local;
  
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) == 0) {
    paths.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = ':';
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_60);
    std::__cxx11::istringstream::istringstream(local_1e0,(string *)&this->m_mtlBaseDir,_S_in);
    std::__cxx11::string::string((string *)&i);
    while( true ) {
      piVar4 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)local_1e0,(string *)&i,
                          paths.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_);
      bVar2 = std::ios::operator_cast_to_bool((ios *)(piVar4 + *(long *)(*(long *)piVar4 + -0x18)));
      if (!bVar2) break;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_60,(value_type *)&i);
    }
    for (filepath.field_2._8_8_ = 0; uVar1 = filepath.field_2._8_8_,
        sVar5 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_60), (ulong)uVar1 < sVar5;
        filepath.field_2._8_8_ = filepath.field_2._8_8_ + 1) {
      dir = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)local_60,filepath.field_2._8_8_);
      JoinPath((string *)local_238,dir,matId);
      pcVar6 = (char *)std::__cxx11::string::c_str();
      std::ifstream::ifstream(&local_440,pcVar6,_S_in);
      bVar2 = std::ios::operator_cast_to_bool
                        ((ios *)((long)&local_440 + *(long *)(local_440 + -0x18)));
      if (bVar2) {
        LoadMtl(matMap,materials,(istream *)&local_440,warn,err);
        this_local._7_1_ = 1;
      }
      local_444 = (uint)bVar2;
      std::ifstream::~ifstream(&local_440);
      std::__cxx11::string::~string((string *)local_238);
      if (local_444 != 0) goto LAB_0011f366;
    }
    std::__cxx11::stringstream::stringstream(local_5d0);
    poVar7 = std::operator<<(local_5c0,"Material file [ ");
    poVar7 = std::operator<<(poVar7,(string *)matId);
    poVar7 = std::operator<<(poVar7," ] not found in a path : ");
    poVar7 = std::operator<<(poVar7,(string *)&this->m_mtlBaseDir);
    std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
    if (warn != (string *)0x0) {
      std::__cxx11::stringstream::str();
      std::__cxx11::string::operator+=
                ((string *)warn,(string *)(filepath_1.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)(filepath_1.field_2._M_local_buf + 8));
    }
    this_local._7_1_ = 0;
    local_444 = 1;
    std::__cxx11::stringstream::~stringstream(local_5d0);
LAB_0011f366:
    std::__cxx11::string::~string((string *)&i);
    std::__cxx11::istringstream::~istringstream(local_1e0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_60);
  }
  else {
    std::__cxx11::string::string(local_610,(string *)matId);
    pcVar6 = (char *)std::__cxx11::string::c_str();
    std::ifstream::ifstream(&local_818,pcVar6,_S_in);
    bVar2 = std::ios::operator_cast_to_bool
                      ((ios *)((long)&local_818 + *(long *)(local_818 + -0x18)));
    if (bVar2) {
      LoadMtl(matMap,materials,(istream *)&local_818,warn,err);
      this_local._7_1_ = 1;
      local_444 = 1;
    }
    else {
      std::__cxx11::stringstream::stringstream(local_9a0);
      poVar7 = std::operator<<(local_990,"Material file [ ");
      poVar7 = std::operator<<(poVar7,local_610);
      poVar7 = std::operator<<(poVar7," ] not found in a path : ");
      poVar7 = std::operator<<(poVar7,(string *)&this->m_mtlBaseDir);
      std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
      if (warn != (string *)0x0) {
        std::__cxx11::stringstream::str();
        std::__cxx11::string::operator+=((string *)warn,local_9c0);
        std::__cxx11::string::~string(local_9c0);
      }
      this_local._7_1_ = 0;
      local_444 = 1;
      std::__cxx11::stringstream::~stringstream(local_9a0);
    }
    std::ifstream::~ifstream(&local_818);
    std::__cxx11::string::~string(local_610);
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool MaterialFileReader::operator()(const std::string &matId,
                                    std::vector<material_t> *materials,
                                    std::map<std::string, int> *matMap,
                                    std::string *warn, std::string *err) {
  if (!m_mtlBaseDir.empty()) {
#ifdef _WIN32
    char sep = ';';
#else
    char sep = ':';
#endif

    // https://stackoverflow.com/questions/5167625/splitting-a-c-stdstring-using-tokens-e-g
    std::vector<std::string> paths;
    std::istringstream f(m_mtlBaseDir);

    std::string s;
    while (getline(f, s, sep)) {
      paths.push_back(s);
    }

    for (size_t i = 0; i < paths.size(); i++) {
      std::string filepath = JoinPath(paths[i], matId);

      std::ifstream matIStream(filepath.c_str());
      if (matIStream) {
        LoadMtl(matMap, materials, &matIStream, warn, err);

        return true;
      }
    }

    std::stringstream ss;
    ss << "Material file [ " << matId
       << " ] not found in a path : " << m_mtlBaseDir << std::endl;
    if (warn) {
      (*warn) += ss.str();
    }
    return false;

  } else {
    std::string filepath = matId;
    std::ifstream matIStream(filepath.c_str());
    if (matIStream) {
      LoadMtl(matMap, materials, &matIStream, warn, err);

      return true;
    }

    std::stringstream ss;
    ss << "Material file [ " << filepath
       << " ] not found in a path : " << m_mtlBaseDir << std::endl;
    if (warn) {
      (*warn) += ss.str();
    }

    return false;
  }
}